

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptProxy.cpp
# Opt level: O2

BOOL __thiscall
Js::JavascriptProxy::DeleteProperty
          (JavascriptProxy *this,PropertyId propertyId,PropertyOperationFlags flags)

{
  ImplicitCallFlags IVar1;
  ScriptContext *pSVar2;
  ThreadContext *this_00;
  code *pcVar3;
  undefined8 obj;
  bool bVar4;
  bool bVar5;
  Attributes attributes;
  BOOL BVar6;
  HostScriptContext *pHVar7;
  RecyclableObject *pRVar8;
  JavascriptFunction *function;
  undefined4 *puVar9;
  PropertyRecord *pPVar10;
  long lVar11;
  undefined1 local_78 [8];
  PropertyDescriptor targetPropertyDescriptor;
  
  pSVar2 = (((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)
           ->super_JavascriptLibraryBase).scriptContext.ptr;
  ThreadContext::ProbeStack(pSVar2->threadContext,0xc00,pSVar2,(PVOID)0x0);
  this_00 = ((((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).
              ptr)->super_JavascriptLibraryBase).scriptContext.ptr)->threadContext;
  if ((this_00->disableImplicitFlags & DisableImplicitCallFlag) != DisableImplicitNoFlag) {
    this_00->implicitCallFlags = this_00->implicitCallFlags | ImplicitCall_External;
    return 0;
  }
  pHVar7 = ThreadContext::GetPreviousHostScriptContext(this_00);
  pSVar2 = pHVar7->scriptContext;
  pRVar8 = MarshalHandler(this,pSVar2);
  if (pRVar8 == (RecyclableObject *)0x0) {
    bVar4 = ThreadContext::RecordImplicitException(this_00);
    if (!bVar4) {
      return 0;
    }
    JavascriptError::ThrowTypeError(pSVar2,-0x7ff5ea15,L"deleteProperty");
  }
  targetPropertyDescriptor._40_8_ = MarshalTarget(this,pSVar2);
  function = GetMethodHelper(this,0x71,pSVar2);
  bVar4 = ScriptContext::IsHeapEnumInProgress
                    ((((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->
                       javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr);
  if (bVar4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptProxy.cpp"
                                ,800,"(!GetScriptContext()->IsHeapEnumInProgress())",
                                "!GetScriptContext()->IsHeapEnumInProgress()");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar9 = 0;
  }
  if (function == (JavascriptFunction *)0x0) {
    BVar6 = ScriptContext::IsNumericPropertyId(pSVar2,propertyId,(uint32 *)local_78);
    lVar11 = 0x108;
    if (BVar6 != 0) {
      lVar11 = 0x150;
      propertyId = local_78._0_4_;
    }
    BVar6 = (**(code **)(*(long *)targetPropertyDescriptor._40_8_ + lVar11))
                      (targetPropertyDescriptor._40_8_,propertyId,flags);
    return BVar6;
  }
  targetPropertyDescriptor.originalVar.ptr = GetName(pSVar2,propertyId);
  obj = targetPropertyDescriptor._40_8_;
  targetPropertyDescriptor.Setter.ptr = (void *)targetPropertyDescriptor._40_8_;
  bVar4 = this_00->reentrancySafeOrHandled;
  this_00->reentrancySafeOrHandled = true;
  local_78 = (undefined1  [8])this_00;
  targetPropertyDescriptor.Value.ptr = function;
  targetPropertyDescriptor.Getter.ptr = pRVar8;
  attributes = FunctionInfo::GetAttributes((RecyclableObject *)function);
  bVar5 = ThreadContext::HasNoSideEffect(this_00,(RecyclableObject *)function,attributes);
  if (bVar5) {
    pRVar8 = (RecyclableObject *)
             DeleteProperty::anon_class_40_5_adc47082::operator()
                       ((anon_class_40_5_adc47082 *)local_78);
    bVar5 = ThreadContext::IsOnStack(pRVar8);
  }
  else {
    if ((this_00->disableImplicitFlags & DisableImplicitCallFlag) != DisableImplicitNoFlag) {
      this_00->implicitCallFlags = this_00->implicitCallFlags | ImplicitCall_Accessor;
      pRVar8 = (((((((((function->super_DynamicObject).super_RecyclableObject.type.ptr)->
                     javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr)->
                 super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
               undefinedValue.ptr;
      goto LAB_00ba60e1;
    }
    if ((attributes & HasNoSideEffect) == None) {
      IVar1 = this_00->implicitCallFlags;
      pRVar8 = (RecyclableObject *)
               DeleteProperty::anon_class_40_5_adc47082::operator()
                         ((anon_class_40_5_adc47082 *)local_78);
      this_00->implicitCallFlags = IVar1 | ImplicitCall_Accessor;
      goto LAB_00ba60e1;
    }
    pRVar8 = (RecyclableObject *)
             DeleteProperty::anon_class_40_5_adc47082::operator()
                       ((anon_class_40_5_adc47082 *)local_78);
    bVar5 = ThreadContext::IsOnStack(pRVar8);
  }
  if (bVar5 != false) {
    this_00->implicitCallFlags = this_00->implicitCallFlags | ImplicitCall_Accessor;
  }
LAB_00ba60e1:
  this_00->reentrancySafeOrHandled = bVar4;
  BVar6 = JavascriptConversion::ToBoolean(pRVar8,pSVar2);
  if (BVar6 == 0) {
    BVar6 = 0;
    if ((flags & PropertyOperation_StrictMode) != PropertyOperation_None) {
      pPVar10 = ThreadContext::GetPropertyName(this_00,propertyId);
      JavascriptError::ThrowTypeErrorVar(pSVar2,-0x7ff5e9d4,L"deleteProperty",pPVar10 + 1);
    }
  }
  else {
    PropertyDescriptor::PropertyDescriptor((PropertyDescriptor *)local_78);
    BVar6 = JavascriptOperators::GetOwnPropertyDescriptor
                      ((RecyclableObject *)obj,propertyId,pSVar2,(PropertyDescriptor *)local_78);
    if ((BVar6 != 0) &&
       (bVar4 = PropertyDescriptor::IsConfigurable((PropertyDescriptor *)local_78), !bVar4)) {
      JavascriptError::ThrowTypeError(pSVar2,-0x7ff5ea14,L"deleteProperty");
    }
    BVar6 = 1;
  }
  return BVar6;
}

Assistant:

BOOL JavascriptProxy::DeleteProperty(PropertyId propertyId, PropertyOperationFlags flags)
    {
        PROBE_STACK(GetScriptContext(), Js::Constants::MinStackDefault);

        // Reject implicit call
        ThreadContext* threadContext = GetScriptContext()->GetThreadContext();
        if (threadContext->IsDisableImplicitCall())
        {
            threadContext->AddImplicitCallFlags(Js::ImplicitCall_External);
            return FALSE;
        }

        // Caller does not pass requestContext. Retrieve from host scriptContext stack.
        ScriptContext* requestContext =
            threadContext->GetPreviousHostScriptContext()->GetScriptContext();

        //1. Assert: IsPropertyKey(P) is true.
        //2. Let handler be the value of the[[ProxyHandler]] internal slot of O.
        RecyclableObject * handlerObj = this->MarshalHandler(requestContext);

        //3. If handler is null, then throw a TypeError exception.
        //6. ReturnIfAbrupt(trap).

        if (handlerObj == nullptr)
        {
            // the proxy has been revoked; TypeError.
            if (!threadContext->RecordImplicitException())
                return FALSE;
            JavascriptError::ThrowTypeError(requestContext, JSERR_ErrorOnRevokedProxy, _u("deleteProperty"));
        }

        //4. Let target be the value of the[[ProxyTarget]] internal slot of O.
        RecyclableObject * targetObj = this->MarshalTarget(requestContext);

        //5. Let trap be the result of GetMethod(handler, "deleteProperty").
        JavascriptFunction* deleteMethod = GetMethodHelper(PropertyIds::deleteProperty, requestContext);

        //7. If trap is undefined, then
        //a.Return the result of calling the[[Delete]] internal method of target with argument P.
        Assert(!GetScriptContext()->IsHeapEnumInProgress());
        if (nullptr == deleteMethod)
        {
            uint32 indexVal;
            if (requestContext->IsNumericPropertyId(propertyId, &indexVal))
            {
                return targetObj->DeleteItem(indexVal, flags);
            }
            else
            {
                return targetObj->DeleteProperty(propertyId, flags);
            }
        }
        //8. Let trapResult be the result of calling the[[Call]] internal method of trap with handler as the this value and a new List containing target and P.
        //9. Let booleanTrapResult be ToBoolean(trapResult).
        //10. ReturnIfAbrupt(booleanTrapResult).
        //11. If booleanTrapResult is false, then return false.

        Var propertyName = GetName(requestContext, propertyId);

        Var deletePropertyResult = threadContext->ExecuteImplicitCall(deleteMethod, ImplicitCall_Accessor, [=]()->Js::Var
        {
            return CALL_FUNCTION(threadContext, deleteMethod, CallInfo(CallFlags_Value, 3), handlerObj, targetObj, propertyName);
        });

        BOOL trapResult = JavascriptConversion::ToBoolean(deletePropertyResult, requestContext);
        if (!trapResult)
        {
            if (flags & PropertyOperation_StrictMode)
            {
                JavascriptError::ThrowTypeErrorVar(
                    requestContext, 
                    JSERR_ProxyHandlerReturnedFalse, 
                    _u("deleteProperty"),
                    threadContext->GetPropertyName(propertyId)->GetBuffer()
                );
            }
            return trapResult;
        }

        //12. Let targetDesc be the result of calling the[[GetOwnProperty]] internal method of target with argument P.
        //13. ReturnIfAbrupt(targetDesc).
        //14. If targetDesc is undefined, then return true.
        //15. If targetDesc.[[Configurable]] is false, then throw a TypeError exception.
        //16. Return true.
        PropertyDescriptor targetPropertyDescriptor;
        if (!Js::JavascriptOperators::GetOwnPropertyDescriptor(targetObj, propertyId, requestContext, &targetPropertyDescriptor))
        {
            return TRUE;
        }
        if (!targetPropertyDescriptor.IsConfigurable())
        {
            JavascriptError::ThrowTypeError(requestContext, JSERR_InconsistentTrapResult, _u("deleteProperty"));
        }
        return TRUE;
    }